

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::CertErrorParams2Der::CertErrorParams2Der
          (CertErrorParams2Der *this,char *name1,Input der1,char *name2,Input der2)

{
  (this->super_CertErrorParams)._vptr_CertErrorParams =
       (_func_int **)&PTR__CertErrorParams2Der_006e76f8;
  this->name1_ = name1;
  (this->der1_)._M_dataplus._M_p = (pointer)&(this->der1_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->der1_,der1.data_.data_,der1.data_.data_ + der1.data_.size_);
  this->name2_ = name2;
  (this->der2_)._M_dataplus._M_p = (pointer)&(this->der2_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->der2_,der2.data_.data_,der2.data_.data_ + der2.data_.size_);
  return;
}

Assistant:

CertErrorParams2Der(const char *name1, der::Input der1, const char *name2,
                      der::Input der2)
      : name1_(name1),
        der1_(BytesAsStringView(der1)),
        name2_(name2),
        der2_(BytesAsStringView(der2)) {}